

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

void LoadConstants(LoadState *S,Proto *f)

{
  lu_byte lVar1;
  byte bVar2;
  int iVar3;
  TValue *pTVar4;
  lua_Integer lVar5;
  TString *pTVar6;
  lua_Number lVar7;
  TString *x_;
  TValue *io_3;
  TValue *io_2;
  TValue *io_1;
  TValue *io;
  int t;
  TValue *o;
  int n;
  int i;
  Proto *f_local;
  LoadState *S_local;
  
  iVar3 = LoadInt(S);
  pTVar4 = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,(long)iVar3 << 4);
  f->k = pTVar4;
  f->sizek = iVar3;
  for (o._4_4_ = 0; o._4_4_ < iVar3; o._4_4_ = o._4_4_ + 1) {
    f->k[o._4_4_].tt_ = 0;
  }
  o._4_4_ = 0;
  do {
    if (iVar3 <= o._4_4_) {
      return;
    }
    pTVar4 = f->k + o._4_4_;
    lVar1 = LoadByte(S);
    switch(lVar1) {
    case '\0':
      pTVar4->tt_ = 0;
      break;
    case '\x01':
      bVar2 = LoadByte(S);
      *(uint *)&pTVar4->value_ = (uint)bVar2;
      pTVar4->tt_ = 1;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                    ,0x97,"void LoadConstants(LoadState *, Proto *)");
    case '\x03':
      lVar7 = LoadNumber(S);
      (pTVar4->value_).n = lVar7;
      pTVar4->tt_ = 3;
      break;
    case '\x04':
    case '\x14':
      pTVar6 = LoadString(S);
      if (9 < (pTVar6->tt & 0xf)) {
        __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                      ,0x94,"void LoadConstants(LoadState *, Proto *)");
      }
      (pTVar4->value_).gc = (GCObject *)pTVar6;
      pTVar4->tt_ = pTVar6->tt | 0x8000;
      if ((pTVar4->tt_ & 0x8000) != 0) {
        if ((pTVar4->tt_ & 0x8000) == 0) {
          __assert_fail("(((io)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                        ,0x94,"void LoadConstants(LoadState *, Proto *)");
        }
        if ((pTVar4->tt_ & 0x7f) != (ushort)((pTVar4->value_).gc)->tt) {
LAB_00141f7c:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                        ,0x94,"void LoadConstants(LoadState *, Proto *)");
        }
        if (S->L != (lua_State *)0x0) {
          if ((pTVar4->tt_ & 0x8000) == 0) {
            __assert_fail("(((io)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                          ,0x94,"void LoadConstants(LoadState *, Proto *)");
          }
          if ((((pTVar4->value_).gc)->marked & (S->L->l_G->currentwhite ^ 0x18)) != 0)
          goto LAB_00141f7c;
        }
      }
      break;
    case '\x13':
      lVar5 = LoadInteger(S);
      (pTVar4->value_).i = lVar5;
      pTVar4->tt_ = 0x13;
    }
    o._4_4_ = o._4_4_ + 1;
  } while( true );
}

Assistant:

static void LoadConstants (LoadState *S, Proto *f) {
  int i;
  int n = LoadInt(S);
  f->k = luaM_newvector(S->L, n, TValue);
  f->sizek = n;
  for (i = 0; i < n; i++)
    setnilvalue(&f->k[i]);
  for (i = 0; i < n; i++) {
    TValue *o = &f->k[i];
    int t = LoadByte(S);
    switch (t) {
    case LUA_TNIL:
      setnilvalue(o);
      break;
    case LUA_TBOOLEAN:
      setbvalue(o, LoadByte(S));
      break;
    case LUA_TNUMFLT:
      setfltvalue(o, LoadNumber(S));
      break;
    case LUA_TNUMINT:
      setivalue(o, LoadInteger(S));
      break;
    case LUA_TSHRSTR:
    case LUA_TLNGSTR:
      setsvalue2n(S->L, o, LoadString(S));
      break;
    default:
      lua_assert(0);
    }
  }
}